

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.h
# Opt level: O1

void __thiscall
slang::ast::CoverageBinSymbol::TransRangeList::visitExprs<only_assigned_on_reset::AlwaysFFVisitor&>
          (TransRangeList *this,AlwaysFFVisitor *visitor)

{
  size_t sVar1;
  pointer ppEVar2;
  Expression *pEVar3;
  long lVar4;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *__range3;
  
  sVar1 = (this->items)._M_extent._M_extent_value;
  if (sVar1 != 0) {
    ppEVar2 = (this->items)._M_ptr;
    lVar4 = 0;
    do {
      pEVar3 = *(Expression **)((long)ppEVar2 + lVar4);
      Expression::
      visitExpression<slang::ast::Expression_const,only_assigned_on_reset::AlwaysFFVisitor&>
                (pEVar3,pEVar3,visitor);
      lVar4 = lVar4 + 8;
    } while (sVar1 << 3 != lVar4);
  }
  pEVar3 = this->repeatFrom;
  if (pEVar3 != (Expression *)0x0) {
    Expression::
    visitExpression<slang::ast::Expression_const,only_assigned_on_reset::AlwaysFFVisitor&>
              (pEVar3,pEVar3,visitor);
  }
  pEVar3 = this->repeatTo;
  if (pEVar3 != (Expression *)0x0) {
    Expression::
    visitExpression<slang::ast::Expression_const,only_assigned_on_reset::AlwaysFFVisitor&>
              (pEVar3,pEVar3,visitor);
    return;
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
            for (auto item : items)
                item->visit(visitor);

            if (repeatFrom)
                repeatFrom->visit(visitor);

            if (repeatTo)
                repeatTo->visit(visitor);
        }